

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

int __thiscall cmCTestScriptHandler::RunCurrentScript(cmCTestScriptHandler *this)

{
  string_view arg;
  bool bVar1;
  ulong uVar2;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_b0;
  duration<double,_std::ratio<1L,_1000000000L>_> local_a8;
  cmDuration local_a0;
  uint local_94;
  uint sleepTime;
  cmDuration minimumInterval;
  duration<long,_std::ratio<1L,_1000000000L>_> local_80;
  type interval;
  time_point startOfInterval;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  local_60;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  ending_time;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  envArgs;
  int result;
  cmCTestScriptHandler *this_local;
  
  SetRunCurrentScript(this,false);
  cmSystemTools::SetRunCommandHideConsole(true);
  envArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = ExtractVariables(this);
  this_local._4_4_ =
       envArgs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  if (envArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      arg = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->CTestEnv);
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_38,arg,false);
      cmSystemTools::AppendEnv
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38);
    }
    if (this->ContinuousDuration < 0.0) {
      envArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = RunConfigurationDashboard(this);
    }
    else {
      UpdateElapsedTime(this);
      local_68.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>
                ((duration<double,std::ratio<1l,1l>> *)&startOfInterval,&this->ContinuousDuration);
      local_60 = std::chrono::operator+
                           (&local_68,(duration<double,_std::ratio<1L,_1L>_> *)&startOfInterval);
      if ((this->EmptyBinDirOnce & 1U) != 0) {
        this->EmptyBinDir = true;
      }
      do {
        interval.__r = std::chrono::_V2::steady_clock::now();
        envArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = RunConfigurationDashboard(this);
        minimumInterval.__r = (rep_conflict)std::chrono::_V2::steady_clock::now();
        local_80.__r = (rep)std::chrono::operator-
                                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)&minimumInterval,
                                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)&interval);
        std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>
                  ((duration<double,std::ratio<1l,1l>> *)&stack0xffffffffffffff70,
                   &this->MinimumInterval);
        bVar1 = std::chrono::operator<
                          (&local_80,
                           (duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffff70);
        if (bVar1) {
          local_a8.__r = (rep_conflict)
                         std::chrono::operator-
                                   ((duration<double,_std::ratio<1L,_1L>_> *)
                                    &stack0xffffffffffffff70,&local_80);
          std::chrono::duration<double,std::ratio<1l,1l>>::
          duration<double,std::ratio<1l,1000000000l>,void>
                    ((duration<double,std::ratio<1l,1l>> *)&local_a0,&local_a8);
          local_94 = cmDurationTo<unsigned_int>(&local_a0);
          SleepInSeconds(local_94);
        }
        if ((this->EmptyBinDirOnce & 1U) != 0) {
          this->EmptyBinDir = false;
        }
        local_b0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        bVar1 = std::chrono::operator<(&local_b0,&local_60);
      } while (bVar1);
    }
    this_local._4_4_ =
         envArgs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int cmCTestScriptHandler::RunCurrentScript()
{
  int result;

  // do not run twice
  this->SetRunCurrentScript(false);

  // no popup widows
  cmSystemTools::SetRunCommandHideConsole(true);

  // extract the vars from the cache and store in ivars
  result = this->ExtractVariables();
  if (result) {
    return result;
  }

  // set any environment variables
  if (!this->CTestEnv.empty()) {
    std::vector<std::string> envArgs = cmExpandedList(this->CTestEnv);
    cmSystemTools::AppendEnv(envArgs);
  }

  // now that we have done most of the error checking finally run the
  // dashboard, we may be asked to repeatedly run this dashboard, such as
  // for a continuous, do we need to run it more than once?
  if (this->ContinuousDuration >= 0) {
    this->UpdateElapsedTime();
    auto ending_time =
      std::chrono::steady_clock::now() + cmDuration(this->ContinuousDuration);
    if (this->EmptyBinDirOnce) {
      this->EmptyBinDir = true;
    }
    do {
      auto startOfInterval = std::chrono::steady_clock::now();
      result = this->RunConfigurationDashboard();
      auto interval = std::chrono::steady_clock::now() - startOfInterval;
      auto minimumInterval = cmDuration(this->MinimumInterval);
      if (interval < minimumInterval) {
        auto sleepTime =
          cmDurationTo<unsigned int>(minimumInterval - interval);
        this->SleepInSeconds(sleepTime);
      }
      if (this->EmptyBinDirOnce) {
        this->EmptyBinDir = false;
      }
    } while (std::chrono::steady_clock::now() < ending_time);
  }
  // otherwise just run it once
  else {
    result = this->RunConfigurationDashboard();
  }

  return result;
}